

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prototype_factory.cpp
# Opt level: O0

void __thiscall Contact::Contact(Contact *this,Contact *other)

{
  bool bVar1;
  Contact *other_local;
  Contact *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)other);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&other->work_address);
  if (bVar1) {
    std::unique_ptr<Address,_std::default_delete<Address>_>::operator*(&other->work_address);
    std::make_unique<Address,Address&>((Address *)&this->work_address);
  }
  else {
    std::unique_ptr<Address,std::default_delete<Address>>::
    unique_ptr<std::default_delete<Address>,void>
              ((unique_ptr<Address,std::default_delete<Address>> *)&this->work_address,
               (nullptr_t)0x0);
  }
  return;
}

Assistant:

Contact(const Contact& other)
		:	name{other.name},
			work_address{other.work_address ? std::make_unique<Address>(*other.work_address) : nullptr}
		{}